

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O2

void device_reset_ymf278b(void *info)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  
  (**(code **)((long)info + 0x660))(*(undefined8 *)((long)info + 0x650));
  *(undefined1 *)((long)info + 0x644) = 0;
  *(undefined8 *)((long)info + 0x500) = 0;
  *(undefined1 *)((long)info + 0x508) = 0;
  for (lVar2 = 0x50; lVar2 != 0x530; lVar2 = lVar2 + 0x34) {
    *(undefined8 *)((long)info + lVar2 + -0x24) = 0x280000000000000;
    puVar1 = (undefined8 *)((long)info + lVar2 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)info + lVar2 + -10) = 0;
    *(undefined4 *)((long)info + lVar2 + -0x28) = 0x8000;
    *(undefined1 *)((long)info + lVar2 + -2) = 0;
    *(undefined8 *)((long)info + lVar2 + -0x30) = 0;
    *(undefined4 *)((long)info + lVar2 + -0x1c) = 0;
    *(undefined2 *)((long)info + lVar2 + -1) = 0;
  }
  *(undefined1 *)((long)info + 0x546) = 0;
  for (iVar3 = 0xff; -1 < iVar3; iVar3 = iVar3 + -1) {
    ymf278b_C_w((YMF278BChip *)info,(UINT8)iVar3,'\0');
  }
  *(undefined4 *)((long)info + 0x51c) = 0;
  *(undefined8 *)((long)info + 0x50c) = 0x300000000;
  *(undefined8 *)((long)info + 0x514) = 3;
  refresh_opl3_volume((YMF278BChip *)info);
  return;
}

Assistant:

static void device_reset_ymf278b(void *info)
{
	YMF278BChip* chip = (YMF278BChip *)info;
	int i;
	
	chip->fm.reset(chip->fm.chip);
	chip->exp = 0x00;
	
	chip->eg_cnt = 0;
	chip->tl_int_cnt = 0;
	chip->tl_int_step = 0;

	for (i = 0; i < 24; i ++)
		ymf278b_slot_reset(&chip->slots[i]);
	chip->regs[2] = 0; // avoid UMR
	for (i = 255; i >= 0; i --)	// reverse order to avoid UMR
		ymf278b_C_w(chip, i, 0);
	
	chip->memadr = 0;
	chip->fm_l = chip->fm_r = 3;
	chip->pcm_l = chip->pcm_r = 0;
	refresh_opl3_volume(chip);
}